

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelConnects::IfcRelConnects(IfcRelConnects *this,void **vtt)

{
  void **vtt_local;
  IfcRelConnects *this_local;
  
  IfcRelationship::IfcRelationship(&this->super_IfcRelationship,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelConnects,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelConnects,_0UL> *)
             &(this->super_IfcRelationship).super_IfcRoot.field_0x98,vtt + 10);
  (this->super_IfcRelationship).super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcRelationship).super_IfcRoot.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)(this->super_IfcRelationship).super_IfcRoot.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3])
       = vtt[0xc];
  *(void **)&(this->super_IfcRelationship).super_IfcRoot.field_0x88 = vtt[0xd];
  *(void **)&(this->super_IfcRelationship).super_IfcRoot.field_0x98 = vtt[0xe];
  return;
}

Assistant:

IfcRelConnects() : Object("IfcRelConnects") {}